

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NoViableAltException.cpp
# Opt level: O0

undefined8 __thiscall NoViableAltException::toString_abi_cxx11_(NoViableAltException *this)

{
  undefined4 uVar1;
  Token *pTVar2;
  long *in_RSI;
  undefined8 in_RDI;
  undefined4 in_stack_ffffffffffffff10;
  allocator *__lhs;
  string local_c8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff48;
  string local_a8 [4];
  int in_stack_ffffffffffffff5c;
  allocator local_71;
  string local_70 [32];
  string local_50 [32];
  string local_30 [48];
  
  pTVar2 = RefCount::operator_cast_to_Token_((RefCount *)(in_RSI + 6));
  if (pTVar2 == (Token *)0x0) {
    (**(code **)(*in_RSI + 0x28))(in_RDI);
  }
  else {
    __lhs = &local_71;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,"line(",__lhs);
    uVar1 = (**(code **)(*in_RSI + 0x30))();
    std::__cxx11::to_string(in_stack_ffffffffffffff5c);
    std::operator+(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                   (char *)CONCAT44(uVar1,in_stack_ffffffffffffff10));
    (**(code **)(*in_RSI + 0x28))(local_c8);
    std::operator+(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
    std::__cxx11::string::~string(local_c8);
    std::__cxx11::string::~string(local_30);
    std::__cxx11::string::~string(local_50);
    std::__cxx11::string::~string(local_a8);
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
  }
  return in_RDI;
}

Assistant:

std::string NoViableAltException::toString() const
{
	if (token)
		return std::string("line(")+std::to_string(getLine())+"), "+getErrorMessage();
	else
		return getErrorMessage();
}